

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaFixupTypeAttributeUses(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaWildcardNsPtr *ppxVar1;
  uint uVar2;
  xmlSchemaTypePtr type_00;
  long *plVar3;
  void *pvVar4;
  xmlSchemaWildcardPtr pxVar5;
  xmlSchemaWildcardPtr pxVar6;
  xmlSchemaWildcardNsPtr pxVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  xmlSchemaItemListPtr list;
  xmlSchemaItemListPtr pxVar15;
  xmlSchemaWildcardNsPtr pxVar16;
  xmlSchemaWildcardNsPtr pxVar17;
  _xmlSchemaWildcardNs *p_Var18;
  xmlSchemaWildcardNsPtr *ppxVar19;
  _xmlSchemaWildcardNs *p_Var20;
  xmlSchemaItemListPtr pxVar21;
  ulong uVar22;
  long lVar23;
  xmlChar *in_R8;
  xmlChar *str2;
  long lVar24;
  
  type_00 = type->baseType;
  if (type_00 == (xmlSchemaTypePtr)0x0) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupTypeAttributeUses","no base type",
               (xmlChar *)0x0,in_R8);
    return -1;
  }
  if (((type_00->type != XML_SCHEMA_TYPE_BASIC) && ((type_00->flags & 0x400000) == 0)) &&
     (iVar14 = xmlSchemaTypeFixup(type_00,(xmlSchemaAbstractCtxtPtr)pctxt), iVar14 == -1)) {
    return -1;
  }
  list = (xmlSchemaItemListPtr)type->attrUses;
  plVar3 = (long *)type_00->attrUses;
  if (list == (xmlSchemaItemListPtr)0x0) {
    pxVar21 = (xmlSchemaItemListPtr)0x0;
  }
  else if ((type->flags & 4) == 0) {
    str2 = (xmlChar *)0x0;
    iVar14 = xmlSchemaExpandAttributeGroupRefs
                       (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,list,
                        (xmlSchemaItemListPtr)0x0);
    pxVar21 = (xmlSchemaItemListPtr)0x0;
    if (iVar14 == -1) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupTypeAttributeUses",
                 "failed to expand attributes",(xmlChar *)0x0,str2);
      pxVar21 = (xmlSchemaItemListPtr)0x0;
    }
  }
  else {
    pxVar21 = pctxt->attrProhibs;
    iVar14 = xmlSchemaExpandAttributeGroupRefs
                       (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,list,pxVar21);
    if (iVar14 == -1) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupTypeAttributeUses",
                 "failed to expand attributes",(xmlChar *)0x0,(xmlChar *)pxVar21);
    }
    pxVar21 = (xmlSchemaItemListPtr)0x0;
    if (pctxt->attrProhibs->nbItems != 0) {
      pxVar21 = pctxt->attrProhibs;
    }
  }
  if (plVar3 != (long *)0x0) {
    if ((type->flags & 4) == 0) {
      bVar8 = true;
      if (0 < (int)plVar3[1]) {
        lVar24 = 0;
        do {
          pvVar4 = *(void **)(*plVar3 + lVar24 * 8);
          if (list == (xmlSchemaItemListPtr)0x0) {
            list = xmlSchemaItemListCreate();
            type->attrUses = list;
            if (list == (xmlSchemaItemListPtr)0x0) {
              list = (xmlSchemaItemListPtr)0x0;
              bVar8 = false;
              goto LAB_001c2543;
            }
          }
          xmlSchemaItemListAddSize(list,(int)plVar3[1],pvVar4);
          lVar24 = lVar24 + 1;
        } while (lVar24 < (int)plVar3[1]);
LAB_001c2541:
        bVar8 = true;
      }
    }
    else {
      if (list == (xmlSchemaItemListPtr)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = list->nbItems;
      }
      bVar8 = true;
      if (0 < (int)plVar3[1]) {
        lVar24 = 0;
        do {
          pvVar4 = *(void **)(*plVar3 + lVar24 * 8);
          pxVar15 = list;
          if ((pxVar21 != (xmlSchemaItemListPtr)0x0) && (0 < (long)pxVar21->nbItems)) {
            lVar23 = 0;
            do {
              if ((*(long *)(*(long *)((long)pvVar4 + 0x18) + 0x10) ==
                   *(long *)((long)pxVar21->items[lVar23] + 0x10)) &&
                 (*(long *)(*(long *)((long)pvVar4 + 0x18) + 0x70) ==
                  *(long *)((long)pxVar21->items[lVar23] + 0x18))) goto LAB_001c2528;
              lVar23 = lVar23 + 1;
            } while (pxVar21->nbItems != lVar23);
          }
          if (0 < (int)uVar2) {
            uVar22 = 0;
            do {
              lVar23 = *(long *)((long)list->items[uVar22] + 0x18);
              if ((*(long *)(*(long *)((long)pvVar4 + 0x18) + 0x10) == *(long *)(lVar23 + 0x10)) &&
                 (*(long *)(*(long *)((long)pvVar4 + 0x18) + 0x70) == *(long *)(lVar23 + 0x70)))
              goto LAB_001c2528;
              uVar22 = uVar22 + 1;
            } while (uVar2 != uVar22);
          }
          if (list == (xmlSchemaItemListPtr)0x0) {
            pxVar15 = xmlSchemaItemListCreate();
            type->attrUses = pxVar15;
            if (pxVar15 == (xmlSchemaItemListPtr)0x0) {
              bVar8 = false;
              goto LAB_001c2543;
            }
          }
          xmlSchemaItemListAddSize(pxVar15,2,pvVar4);
LAB_001c2528:
          lVar24 = lVar24 + 1;
          list = pxVar15;
        } while (lVar24 < (int)plVar3[1]);
        goto LAB_001c2541;
      }
    }
LAB_001c2543:
    if (!bVar8) {
      return -1;
    }
  }
  if ((list != (xmlSchemaItemListPtr)0x0) && (list->nbItems == 0)) {
    if (list->items != (void **)0x0) {
      (*xmlFree)(list->items);
    }
    (*xmlFree)(list);
    type->attrUses = (void *)0x0;
  }
  if ((type->flags & 2) == 0) {
    return 0;
  }
  pxVar5 = type_00->attributeWildcard;
  if (pxVar5 == (xmlSchemaWildcardPtr)0x0) {
    return 0;
  }
  pxVar6 = type->attributeWildcard;
  if (pxVar6 == (xmlSchemaWildcardPtr)0x0) {
    type->attributeWildcard = pxVar5;
    return 0;
  }
  if (pxVar6->any != pxVar5->any) {
    if (pxVar6->any != 0) {
      return 0;
    }
    pxVar6->any = 1;
    pxVar17 = pxVar6->nsSet;
    if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
      do {
        p_Var20 = pxVar17->next;
        (*xmlFree)(pxVar17);
        pxVar17 = p_Var20;
      } while (p_Var20 != (_xmlSchemaWildcardNs *)0x0);
      pxVar6->nsSet = (xmlSchemaWildcardNsPtr)0x0;
    }
    if (pxVar6->negNsSet != (xmlSchemaWildcardNsPtr)0x0) {
      (*xmlFree)(pxVar6->negNsSet);
      pxVar6->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
      return 0;
    }
    return 0;
  }
  pxVar17 = pxVar6->nsSet;
  p_Var20 = pxVar5->nsSet;
  if ((pxVar17 == (xmlSchemaWildcardNsPtr)0x0) != (p_Var20 != (xmlSchemaWildcardNsPtr)0x0)) {
    pxVar16 = pxVar6->negNsSet;
    if (((pxVar16 == (xmlSchemaWildcardNsPtr)0x0) !=
         (pxVar5->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) &&
       ((pxVar16 == (xmlSchemaWildcardNsPtr)0x0 || (pxVar16->value == pxVar5->negNsSet->value)))) {
      if (pxVar17 == (xmlSchemaWildcardNsPtr)0x0) {
        return 0;
      }
      pxVar16 = (xmlSchemaWildcardNsPtr)&pxVar5->nsSet;
      p_Var18 = pxVar17;
      while (pxVar16 = pxVar16->next, pxVar16 != (xmlSchemaWildcardNsPtr)0x0) {
        if ((p_Var18->value == pxVar16->value) &&
           (p_Var18 = p_Var18->next, pxVar16 = (xmlSchemaWildcardNsPtr)&pxVar5->nsSet,
           p_Var18 == (_xmlSchemaWildcardNs *)0x0)) {
          return 0;
        }
      }
    }
  }
  if ((pxVar17 != (xmlSchemaWildcardNsPtr)0x0) && (p_Var20 != (xmlSchemaWildcardNsPtr)0x0)) {
    do {
      p_Var18 = pxVar17;
      do {
        if (p_Var20->value == p_Var18->value) goto LAB_001c2669;
        p_Var18 = p_Var18->next;
      } while (p_Var18 != (_xmlSchemaWildcardNs *)0x0);
      pxVar16 = xmlSchemaNewWildcardNsConstraint(pctxt);
      if (pxVar16 == (xmlSchemaWildcardNsPtr)0x0) {
        return -1;
      }
      pxVar16->value = p_Var20->value;
      pxVar16->next = pxVar6->nsSet;
      pxVar6->nsSet = pxVar16;
LAB_001c2669:
      p_Var20 = p_Var20->next;
      if (p_Var20 == (_xmlSchemaWildcardNs *)0x0) {
        return 0;
      }
    } while( true );
  }
  ppxVar1 = &pxVar6->negNsSet;
  pxVar16 = pxVar6->negNsSet;
  if (pxVar16 != (xmlSchemaWildcardNsPtr)0x0) {
    if ((pxVar5->negNsSet != (xmlSchemaWildcardNsPtr)0x0) &&
       (pxVar16->value != pxVar5->negNsSet->value)) goto LAB_001c2723;
    if ((p_Var20 != (xmlSchemaWildcardNsPtr)0x0) && (pxVar16->value != (xmlChar *)0x0))
    goto LAB_001c2755;
  }
  pxVar7 = pxVar5->negNsSet;
  if (((pxVar7 != (xmlSchemaWildcardNsPtr)0x0) && (pxVar17 != (xmlSchemaWildcardNsPtr)0x0)) &&
     (pxVar7->value != (xmlChar *)0x0)) {
LAB_001c2755:
    if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
      p_Var20 = pxVar17;
    }
    if (p_Var20 == (xmlSchemaWildcardNsPtr)0x0) {
      bVar8 = false;
      bVar10 = false;
      bVar11 = false;
    }
    else {
      ppxVar19 = &pxVar5->negNsSet;
      if (pxVar17 == (xmlSchemaWildcardNsPtr)0x0) {
        ppxVar19 = ppxVar1;
      }
      bVar13 = false;
      bVar8 = false;
      bVar11 = false;
      do {
        if (p_Var20->value == (xmlChar *)0x0) {
          bVar13 = true;
          bVar9 = bVar8;
          bVar12 = bVar11;
        }
        else {
          bVar9 = true;
          bVar12 = true;
          if (p_Var20->value != (*ppxVar19)->value) {
            bVar9 = bVar8;
            bVar12 = bVar11;
          }
        }
        bVar8 = true;
        bVar10 = true;
        bVar11 = true;
      } while ((!bVar12 || !bVar13) &&
              (p_Var20 = p_Var20->next, bVar8 = bVar9, bVar10 = bVar13, bVar11 = bVar12,
              p_Var20 != (_xmlSchemaWildcardNs *)0x0));
    }
    if (!(bool)(bVar11 & bVar10)) {
      if (bVar11 && !bVar10) {
        if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
          do {
            p_Var20 = pxVar17->next;
            (*xmlFree)(pxVar17);
            pxVar17 = p_Var20;
          } while (p_Var20 != (_xmlSchemaWildcardNs *)0x0);
          pxVar6->nsSet = (xmlSchemaWildcardNsPtr)0x0;
        }
        if (*ppxVar1 == (xmlSchemaWildcardNsPtr)0x0) {
          pxVar17 = xmlSchemaNewWildcardNsConstraint(pctxt);
          *ppxVar1 = pxVar17;
          if (pxVar17 == (xmlSchemaWildcardNsPtr)0x0) {
            return -1;
          }
        }
        (*ppxVar1)->value = (xmlChar *)0x0;
        return 0;
      }
      if ((bool)(!bVar8 & bVar10)) {
        xmlSchemaPErr(pctxt,pxVar6->node,0x702,"The union of the wildcard is not expressible.\n",
                      (xmlChar *)0x0,(xmlChar *)0x0);
        return 0;
      }
      if (pxVar16 == (xmlSchemaWildcardNsPtr)0x0) {
        if (bVar11 || bVar10) {
          return 0;
        }
        if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
          do {
            p_Var20 = pxVar17->next;
            (*xmlFree)(pxVar17);
            pxVar17 = p_Var20;
          } while (p_Var20 != (_xmlSchemaWildcardNs *)0x0);
          pxVar6->nsSet = (xmlSchemaWildcardNsPtr)0x0;
        }
        pxVar17 = xmlSchemaNewWildcardNsConstraint(pctxt);
        *ppxVar1 = pxVar17;
        if (pxVar17 == (xmlSchemaWildcardNsPtr)0x0) {
          return -1;
        }
        pxVar17->value = pxVar5->negNsSet->value;
        return 0;
      }
      return 0;
    }
    pxVar6->any = 1;
    if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
      do {
        p_Var20 = pxVar17->next;
        (*xmlFree)(pxVar17);
        pxVar17 = p_Var20;
      } while (p_Var20 != (_xmlSchemaWildcardNs *)0x0);
      pxVar6->nsSet = (xmlSchemaWildcardNsPtr)0x0;
    }
    pxVar17 = *ppxVar1;
LAB_001c29be:
    if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
      (*xmlFree)(pxVar17);
      *ppxVar1 = (xmlSchemaWildcardNsPtr)0x0;
      return 0;
    }
    return 0;
  }
  if (((pxVar16 == (xmlSchemaWildcardNsPtr)0x0) || (p_Var20 == (xmlSchemaWildcardNsPtr)0x0)) ||
     (pxVar16->value != (xmlChar *)0x0)) {
    if (pxVar7 == (xmlSchemaWildcardNsPtr)0x0) {
      return 0;
    }
    if (pxVar17 == (xmlSchemaWildcardNsPtr)0x0) {
      return 0;
    }
    if (pxVar7->value != (xmlChar *)0x0) {
      return 0;
    }
  }
  if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
    p_Var20 = pxVar17;
  }
  for (; p_Var20 != (xmlSchemaWildcardNsPtr)0x0; p_Var20 = p_Var20->next) {
    if (p_Var20->value == (xmlChar *)0x0) {
      pxVar6->any = 1;
      if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
        do {
          p_Var20 = pxVar17->next;
          (*xmlFree)(pxVar17);
          pxVar17 = p_Var20;
        } while (p_Var20 != (_xmlSchemaWildcardNs *)0x0);
        pxVar6->nsSet = (xmlSchemaWildcardNsPtr)0x0;
      }
      pxVar17 = *ppxVar1;
      goto LAB_001c29be;
    }
  }
  if (pxVar16 != (xmlSchemaWildcardNsPtr)0x0) {
    return 0;
  }
  if (pxVar17 != (xmlSchemaWildcardNsPtr)0x0) {
    do {
      p_Var20 = pxVar17->next;
      (*xmlFree)(pxVar17);
      pxVar17 = p_Var20;
    } while (p_Var20 != (_xmlSchemaWildcardNs *)0x0);
    pxVar6->nsSet = (xmlSchemaWildcardNsPtr)0x0;
  }
  pxVar16 = xmlSchemaNewWildcardNsConstraint(pctxt);
  *ppxVar1 = pxVar16;
  if (pxVar16 == (xmlSchemaWildcardNsPtr)0x0) {
    return -1;
  }
LAB_001c2723:
  pxVar16->value = (xmlChar *)0x0;
  return 0;
}

Assistant:

static int
xmlSchemaFixupTypeAttributeUses(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaTypePtr type)
{
    xmlSchemaTypePtr baseType = NULL;
    xmlSchemaAttributeUsePtr use;
    xmlSchemaItemListPtr uses, baseUses, prohibs = NULL;

    if (type->baseType == NULL) {
	PERROR_INT("xmlSchemaFixupTypeAttributeUses",
	    "no base type");
        return (-1);
    }
    baseType = type->baseType;
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	if (xmlSchemaTypeFixup(baseType, ACTXT_CAST pctxt) == -1)
	    return(-1);

    uses = type->attrUses;
    baseUses = baseType->attrUses;
    /*
    * Expand attribute group references. And build the 'complete'
    * wildcard, i.e. intersect multiple wildcards.
    * Move attribute prohibitions into a separate list.
    */
    if (uses != NULL) {
	if (WXS_IS_RESTRICTION(type)) {
	    /*
	    * This one will transfer all attr. prohibitions
	    * into pctxt->attrProhibs.
	    */
	    if (xmlSchemaExpandAttributeGroupRefs(pctxt,
		WXS_BASIC_CAST type, &(type->attributeWildcard), uses,
		pctxt->attrProhibs) == -1)
	    {
		PERROR_INT("xmlSchemaFixupTypeAttributeUses",
		"failed to expand attributes");
	    }
	    if (pctxt->attrProhibs->nbItems != 0)
		prohibs = pctxt->attrProhibs;
	} else {
	    if (xmlSchemaExpandAttributeGroupRefs(pctxt,
		WXS_BASIC_CAST type, &(type->attributeWildcard), uses,
		NULL) == -1)
	    {
		PERROR_INT("xmlSchemaFixupTypeAttributeUses",
		"failed to expand attributes");
	    }
	}
    }
    /*
    * Inherit the attribute uses of the base type.
    */
    if (baseUses != NULL) {
	int i, j;
	xmlSchemaAttributeUseProhibPtr pro;

	if (WXS_IS_RESTRICTION(type)) {
	    int usesCount;
	    xmlSchemaAttributeUsePtr tmp;

	    if (uses != NULL)
		usesCount = uses->nbItems;
	    else
		usesCount = 0;

	    /* Restriction. */
	    for (i = 0; i < baseUses->nbItems; i++) {
		use = baseUses->items[i];
		if (prohibs) {
		    /*
		    * Filter out prohibited uses.
		    */
		    for (j = 0; j < prohibs->nbItems; j++) {
			pro = prohibs->items[j];
			if ((WXS_ATTRUSE_DECL_NAME(use) == pro->name) &&
			    (WXS_ATTRUSE_DECL_TNS(use) ==
				pro->targetNamespace))
			{
			    goto inherit_next;
			}
		    }
		}
		if (usesCount) {
		    /*
		    * Filter out existing uses.
		    */
		    for (j = 0; j < usesCount; j++) {
			tmp = uses->items[j];
			if ((WXS_ATTRUSE_DECL_NAME(use) ==
				WXS_ATTRUSE_DECL_NAME(tmp)) &&
			    (WXS_ATTRUSE_DECL_TNS(use) ==
				WXS_ATTRUSE_DECL_TNS(tmp)))
			{
			    goto inherit_next;
			}
		    }
		}
		if (uses == NULL) {
		    type->attrUses = xmlSchemaItemListCreate();
		    if (type->attrUses == NULL)
			goto exit_failure;
		    uses = type->attrUses;
		}
		xmlSchemaItemListAddSize(uses, 2, use);
inherit_next: {}
	    }
	} else {
	    /* Extension. */
	    for (i = 0; i < baseUses->nbItems; i++) {
		use = baseUses->items[i];
		if (uses == NULL) {
		    type->attrUses = xmlSchemaItemListCreate();
		    if (type->attrUses == NULL)
			goto exit_failure;
		    uses = type->attrUses;
		}
		xmlSchemaItemListAddSize(uses, baseUses->nbItems, use);
	    }
	}
    }
    /*
    * Shrink attr. uses.
    */
    if (uses) {
	if (uses->nbItems == 0) {
	    xmlSchemaItemListFree(uses);
	    type->attrUses = NULL;
	}
	/*
	* TODO: We could shrink the size of the array
	* to fit the actual number of items.
	*/
    }
    /*
    * Compute the complete wildcard.
    */
    if (WXS_IS_EXTENSION(type)) {
	if (baseType->attributeWildcard != NULL) {
	    /*
	    * (3.2.2.1) "If the `base wildcard` is non-`absent`, then
	    * the appropriate case among the following:"
	    */
	    if (type->attributeWildcard != NULL) {
		/*
		* Union the complete wildcard with the base wildcard.
		* SPEC {attribute wildcard}
		* (3.2.2.1.2) "otherwise a wildcard whose {process contents}
		* and {annotation} are those of the `complete wildcard`,
		* and whose {namespace constraint} is the intensional union
		* of the {namespace constraint} of the `complete wildcard`
		* and of the `base wildcard`, as defined in Attribute
		* Wildcard Union ($3.10.6)."
		*/
		if (xmlSchemaUnionWildcards(pctxt, type->attributeWildcard,
		    baseType->attributeWildcard) == -1)
		    goto exit_failure;
	    } else {
		/*
		* (3.2.2.1.1) "If the `complete wildcard` is `absent`,
		* then the `base wildcard`."
		*/
		type->attributeWildcard = baseType->attributeWildcard;
	    }
	} else {
	    /*
	    * (3.2.2.2) "otherwise (the `base wildcard` is `absent`) the
	    * `complete wildcard`"
	    * NOOP
	    */
	}
    } else {
	/*
	* SPEC {attribute wildcard}
	* (3.1) "If the <restriction> alternative is chosen, then the
	* `complete wildcard`;"
	* NOOP
	*/
    }

    return (0);

exit_failure:
    return(-1);
}